

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint32_t farmhashmk::Hash32(char *s,size_t len)

{
  uint32_t a;
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (0x18 < len) {
    auVar10._8_4_ = 0xcc9e2d51;
    auVar10._0_8_ = 0xcc9e2d51cc9e2d51;
    auVar10._12_4_ = 0xcc9e2d51;
    auVar13._8_4_ = 0x16a88000;
    auVar13._0_8_ = 0x16a8800016a88000;
    auVar13._12_4_ = 0x16a88000;
    iVar3 = (uint)len * -0x3361d2af;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(s + (len - 8));
    auVar11 = vpmulld_avx(auVar9,auVar10);
    auVar9 = vpmulld_avx(auVar9,auVar13);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)(s + (len - 0x10));
    auVar10 = vpmulld_avx(auVar15,auVar10);
    auVar13 = vpmulld_avx(auVar15,auVar13);
    auVar16._8_4_ = 5;
    auVar16._0_8_ = 0x500000005;
    auVar16._12_4_ = 5;
    auVar11 = vpsrld_avx(auVar11,0x11);
    auVar10 = vpsrld_avx(auVar10,0x11);
    auVar11 = vpor_avx(auVar11,auVar9);
    auVar12._8_4_ = 0x1b873593;
    auVar12._0_8_ = 0x1b8735931b873593;
    auVar12._12_4_ = 0x1b873593;
    auVar10 = vpor_avx(auVar10,auVar13);
    auVar14._8_4_ = 0xe6546b64;
    auVar14._0_8_ = 0xe6546b64e6546b64;
    auVar14._12_4_ = 0xe6546b64;
    auVar11 = vpshufd_avx(auVar11,0xe1);
    uVar7 = (*(int *)(s + (len - 0x14)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0x14)) * -0x3361d2af) >> 0x11) * 0x1b873593 + iVar3;
    uVar7 = (uVar7 >> 0x13 | uVar7 * 0x2000) + 0x71;
    auVar9 = vpmulld_avx(auVar11,auVar12);
    auVar10 = vpmulld_avx(auVar10,auVar12);
    auVar11 = vpinsrd_avx(ZEXT416((uint)len),iVar3,1);
    auVar11 = vprold_avx512vl(auVar9 ^ auVar11,0xd);
    auVar11 = vpmulld_avx(auVar11,auVar16);
    auVar11 = vpaddd_avx(auVar11,auVar14);
    auVar11 = vprold_avx512vl(auVar11 ^ auVar10,0xd);
    auVar11 = vpmulld_avx(auVar11,auVar16);
    auVar11 = vpaddd_avx(auVar11,auVar14);
    uVar6 = (len - 1) / 0x14;
    do {
      iVar3 = *(int *)s;
      uVar2 = *(uint32_t *)((long)s + 8);
      a = *(uint32_t *)((long)s + 0xc);
      iVar1 = *(int *)((long)s + 4);
      uVar8 = *(uint *)((long)s + 0x10);
      uVar4 = util::Mur(a,auVar11._0_4_ + iVar3);
      uVar5 = util::Mur(uVar2,auVar11._4_4_ + iVar1);
      iVar3 = uVar5 + iVar3;
      uVar2 = util::Mur(uVar8 * -0x3361d2af + iVar1,uVar7 + uVar2);
      s = (char *)((long)s + 0x14);
      uVar7 = a + iVar3 + uVar2;
      auVar11 = vpinsrd_avx(ZEXT416(uVar8),iVar3,1);
      uVar6 = uVar6 - 1;
      auVar9 = vpinsrd_avx(ZEXT416(uVar4),uVar7,1);
      auVar11 = vpaddd_avx(auVar9,auVar11);
    } while (uVar6 != 0);
    uVar8 = auVar11._4_4_ >> 0xb;
    uVar8 = auVar11._0_4_ +
            (uVar8 * 0x16a88000 | (uVar8 | auVar11._4_4_ << 0x15) * -0x3361d2af >> 0x11) *
            -0x3361d2af;
    uVar8 = (uVar8 >> 0x13 | uVar8 * 0x2000) * 5 + 0xe6546b64;
    iVar3 = (uVar8 >> 0x11 | uVar8 * 0x8000) +
            ((uVar7 >> 0xb) * 0x16a88000 | (uVar7 >> 0xb | uVar7 * 0x200000) * -0x3361d2af >> 0x11);
    uVar7 = (iVar3 * -0x3a55e000 | (uint)(iVar3 * -0x3361d2af) >> 0x13) * 5 + 0xe6546b64;
    return (uVar7 >> 0x11 | uVar7 * 0x8000) * -0x3361d2af;
  }
  if (len < 0xd) {
    if (len < 5) {
      uVar2 = Hash32Len0to4(s,len,0);
      return uVar2;
    }
    uVar2 = Hash32Len5to12(s,len,0);
    return uVar2;
  }
  uVar2 = Hash32Len13to24(s,len,0);
  return uVar2;
}

Assistant:

uint32_t Hash32(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? Hash32Len0to4(s, len) : Hash32Len5to12(s, len)) :
        Hash32Len13to24(s, len);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = Rotate(Fetch(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = Rotate(Fetch(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = Rotate(Fetch(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = Rotate(Fetch(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = Rotate(Fetch(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = Rotate(f, 19) + 113;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a = Fetch(s);
    uint32_t b = Fetch(s + 4);
    uint32_t c = Fetch(s + 8);
    uint32_t d = Fetch(s + 12);
    uint32_t e = Fetch(s + 16);
    h += a;
    g += b;
    f += c;
    h = Mur(d, h) + e;
    g = Mur(c, g) + a;
    f = Mur(b + e * c1, f) + d;
    f += g;
    g += f;
    s += 20;
  } while (--iters != 0);
  g = Rotate(g, 11) * c1;
  g = Rotate(g, 17) * c1;
  f = Rotate(f, 11) * c1;
  f = Rotate(f, 17) * c1;
  h = Rotate(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  h = Rotate(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  return h;
}